

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatTimeInMillisAsDuration_abi_cxx11_(TimeInMillis ms)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,(double)local_10 * 0.001);
  std::operator<<(poVar1,"s");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string FormatTimeInMillisAsDuration(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << (static_cast<double>(ms) * 1e-3) << "s";
  return ss.str();
}